

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall tinyusdz::Attribute::Attribute(Attribute *this,Attribute *param_1)

{
  pointer pcVar1;
  vtable_type *pvVar2;
  
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  pcVar1 = (param_1->_name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->_name)._M_string_length);
  this->_varying_authored = param_1->_varying_authored;
  this->_variability = param_1->_variability;
  (this->_type_name)._M_dataplus._M_p = (pointer)&(this->_type_name).field_2;
  pcVar1 = (param_1->_type_name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_type_name,pcVar1,pcVar1 + (param_1->_type_name)._M_string_length);
  pvVar2 = (param_1->_var)._value.v_.vtable;
  (this->_var)._value.v_.vtable = pvVar2;
  if (pvVar2 != (vtable_type *)0x0) {
    (*pvVar2->copy)((storage_union *)&param_1->_var,(storage_union *)&this->_var);
  }
  (this->_var)._blocked = (param_1->_var)._blocked;
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::vector(&(this->_var)._ts._samples,&(param_1->_var)._ts._samples);
  (this->_var)._ts._dirty = (param_1->_var)._ts._dirty;
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->_paths,&param_1->_paths);
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  return;
}

Assistant:

Attribute() = default;